

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::RaiseScope(cmMakefile *this,string *var,char *varDef)

{
  bool bVar1;
  ostream *poVar2;
  ostringstream m;
  string local_1b0;
  undefined1 local_190 [376];
  
  if (var->_M_string_length != 0) {
    bVar1 = Internals::RaiseScope((this->Internal).x_,var,varDef,this);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Cannot set \"",0xc);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_190,(var->_M_dataplus)._M_p,var->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"\": current scope has no parent.",0x1f);
      std::__cxx11::stringbuf::str();
      IssueMessage(this,AUTHOR_WARNING,&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
      std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
    }
  }
  return;
}

Assistant:

cmSourceFile*
cmMakefile::AddCustomCommandToOutput(const std::string& output,
                                     const std::vector<std::string>& depends,
                                     const std::string& main_dependency,
                                     const cmCustomCommandLines& commandLines,
                                     const char* comment,
                                     const char* workingDir,
                                     bool replace,
                                     bool escapeOldStyle,
                                     bool uses_terminal)
{
  std::vector<std::string> outputs;
  outputs.push_back(output);
  std::vector<std::string> no_byproducts;
  return this->AddCustomCommandToOutput(outputs, no_byproducts,
                                        depends, main_dependency,
                                        commandLines, comment, workingDir,
                                        replace, escapeOldStyle,
                                        uses_terminal);
}